

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Extension_Test::
LazilyBuildDependenciesTest_Extension_Test(LazilyBuildDependenciesTest_Extension_Test *this)

{
  LazilyBuildDependenciesTest::LazilyBuildDependenciesTest(&this->super_LazilyBuildDependenciesTest)
  ;
  (this->super_LazilyBuildDependenciesTest).super_Test._vptr_Test =
       (_func_int **)&PTR__LazilyBuildDependenciesTest_015fdd48;
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Extension) {
  ParseProtoAndAddToDb(
      R"pb(
        name: 'foo.proto'
        package: 'proto2_unittest'
        dependency: 'bar.proto'
        dependency: 'baz.proto'
        extension {
          extendee: '.proto2_unittest.Bar'
          name: 'bar'
          number: 11
          label: LABEL_OPTIONAL
          type: TYPE_MESSAGE
          type_name: '.proto2_unittest.Baz'
        }
      )pb");
  ParseProtoAndAddToDb(
      R"pb(
        name: 'bar.proto'
        package: 'proto2_unittest'
        message_type {
          name: 'Bar'
          extension_range { start: 10 end: 20 }
        }
      )pb");
  AddSimpleMessageProtoFileToDb("baz", "Baz");

  // Verify none have been built yet.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("baz.proto"));

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify foo.bar gets loaded, and bar.proto gets loaded
  // to register the extension. baz.proto should not get loaded.
  EXPECT_TRUE(file != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_TRUE(pool_.InternalIsFileLoaded("bar.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("baz.proto"));
}